

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getDSAPrivateKey(SoftHSM *this,DSAPrivateKey *privateKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString local_f0;
  ByteString value;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || privateKey == (DSAPrivateKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || privateKey == (DSAPrivateKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&prime);
  ByteString::ByteString(&subprime);
  ByteString::ByteString(&generator);
  ByteString::ByteString(&value);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_f0,key,0x130);
    ByteString::operator=(&prime,&local_f0);
    ByteString::~ByteString(&local_f0);
    (*key->_vptr_OSObject[6])(&local_f0,key,0x131);
    ByteString::operator=(&subprime,&local_f0);
    ByteString::~ByteString(&local_f0);
    (*key->_vptr_OSObject[6])(&local_f0,key,0x132);
    ByteString::operator=(&generator,&local_f0);
    ByteString::~ByteString(&local_f0);
    (*key->_vptr_OSObject[6])(&local_f0,key,0x11);
    ByteString::operator=(&value,&local_f0);
    ByteString::~ByteString(&local_f0);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_f0,key,0x130);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&prime,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_00135b04;
    (*key->_vptr_OSObject[6])(&local_f0,key,0x131);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&subprime,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    if ((char)iVar1 == '\0') goto LAB_00135b04;
    (*key->_vptr_OSObject[6])(&local_f0,key,0x132);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&generator,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    if ((char)iVar1 == '\0') goto LAB_00135b04;
    (*key->_vptr_OSObject[6])(&local_f0,key,0x11);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&value,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    if ((char)iVar1 == '\0') goto LAB_00135b04;
  }
  (**(code **)(*(long *)privateKey + 0x48))(privateKey,&prime);
  (**(code **)(*(long *)privateKey + 0x50))(privateKey,&subprime);
  (**(code **)(*(long *)privateKey + 0x58))(privateKey,&generator);
  (**(code **)(*(long *)privateKey + 0x40))(privateKey,&value);
  CVar4 = 0;
LAB_00135b04:
  ByteString::~ByteString(&value);
  ByteString::~ByteString(&generator);
  ByteString::~ByteString(&subprime);
  ByteString::~ByteString(&prime);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getDSAPrivateKey(DSAPrivateKey* privateKey, Token* token, OSObject* key)
{
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// DSA Private Key Attributes
	ByteString prime;
	ByteString subprime;
	ByteString generator;
	ByteString value;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME), prime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_SUBPRIME), subprime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_BASE), generator);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_VALUE), value);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		prime = key->getByteStringValue(CKA_PRIME);
		subprime = key->getByteStringValue(CKA_SUBPRIME);
		generator = key->getByteStringValue(CKA_BASE);
		value = key->getByteStringValue(CKA_VALUE);
	}

	privateKey->setP(prime);
	privateKey->setQ(subprime);
	privateKey->setG(generator);
	privateKey->setX(value);

	return CKR_OK;
}